

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O2

bool __thiscall
MD5::checkFileChecksum(MD5 *this,char *checksum,char *filename,qpdf_offset_t up_to_offset)

{
  bool bVar1;
  string actual_checksum;
  string local_30;
  
  getFileChecksum_abi_cxx11_(&local_30,(MD5 *)checksum,filename,up_to_offset);
  bVar1 = std::operator==((char *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
MD5::checkFileChecksum(char const* const checksum, char const* filename, qpdf_offset_t up_to_offset)
{
    bool result = false;
    try {
        std::string actual_checksum = getFileChecksum(filename, up_to_offset);
        result = (checksum == actual_checksum);
    } catch (std::runtime_error const&) {
        // Ignore -- return false
    }
    return result;
}